

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_hlsl.cpp
# Opt level: O1

void __thiscall spirv_cross::CompilerHLSL::emit_buffer_block(CompilerHLSL *this,SPIRVariable *var)

{
  ID *__k;
  ID *ts;
  unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *variables_primary;
  uint uVar1;
  size_t sVar2;
  pointer pcVar3;
  bool bVar4;
  SPIRType *pSVar5;
  size_type sVar6;
  SPIRType *type;
  mapped_type *pmVar7;
  mapped_type *pmVar8;
  iterator iVar9;
  mapped_type *pmVar10;
  string *psVar11;
  runtime_error *prVar12;
  char *pcVar13;
  string *ts_2;
  TypedID<(spirv_cross::Types)0> *in_R9;
  __hashtable *__h;
  uint32_t index;
  ulong uVar14;
  long lVar15;
  char (*in_stack_fffffffffffffee8) [69];
  __node_gen_type __node_gen;
  __hashtable_alloc local_100 [16];
  ID *local_f0;
  SPIRType *local_e8;
  string member_name;
  string local_c0;
  uint32_t failed_index_1;
  uint uStack_9c;
  Bitset flags;
  uint32_t failed_index;
  uint uStack_54;
  char local_48 [16];
  TypedID<(spirv_cross::Types)1> *local_38;
  
  pSVar5 = Variant::get<spirv_cross::SPIRType>
                     ((this->super_CompilerGLSL).super_Compiler.ir.ids.
                      super_VectorView<spirv_cross::Variant>.ptr +
                      *(uint *)&(var->super_IVariant).field_0xc);
  local_e8 = pSVar5;
  if ((var->storage == StorageClassStorageBuffer) ||
     (bVar4 = Compiler::has_decoration
                        ((Compiler *)this,(ID)(pSVar5->super_IVariant).self.id,DecorationBufferBlock
                        ), bVar4)) {
    ParsedIR::get_buffer_block_flags(&flags,&(this->super_CompilerGLSL).super_Compiler.ir,var);
    if ((flags.lower & 0x1000000) == 0) {
      bVar4 = false;
    }
    else {
      bVar4 = is_hlsl_force_storage_buffer_as_uav(this,(ID)(var->super_IVariant).self.id);
      bVar4 = !bVar4;
    }
    pSVar5 = local_e8;
    __node_gen._M_h._0_4_ = (var->super_IVariant).self.id;
    sVar6 = ::std::
            _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
            ::count(&(this->super_CompilerGLSL).super_Compiler.interlocked_resources._M_h,
                    (key_type *)&__node_gen);
    pcVar13 = "RasterizerOrderedByteAddressBuffer ";
    if (sVar6 == 0) {
      pcVar13 = "RWByteAddressBuffer ";
    }
    _failed_index = "ByteAddressBuffer ";
    if (!bVar4) {
      _failed_index = pcVar13;
    }
    CompilerGLSL::add_resource_name(&this->super_CompilerGLSL,(var->super_IVariant).self.id);
    _failed_index_1 = "globallycoherent ";
    if (bVar4 || ((uint)flags.lower >> 0x17 & 1) == 0) {
      _failed_index_1 = "";
    }
    (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[6])
              (&__node_gen,this,(ulong)(var->super_IVariant).self.id,1);
    (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[0x23])(&member_name,this,pSVar5);
    to_resource_binding_abi_cxx11_(&local_c0,this,var);
    CompilerGLSL::
    statement<char_const*,char_const*&,std::__cxx11::string,std::__cxx11::string,std::__cxx11::string,char_const(&)[2]>
              (&this->super_CompilerGLSL,(char **)&failed_index_1,(char **)&failed_index,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&__node_gen,
               &member_name,&local_c0,(char (*) [2])0x2ddbde);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_c0._M_dataplus._M_p != &local_c0.field_2) {
      operator_delete(local_c0._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)member_name._M_dataplus._M_p != &member_name.field_2) {
      operator_delete(member_name._M_dataplus._M_p);
    }
    if (__node_gen._M_h != local_100) {
      operator_delete(__node_gen._M_h);
    }
    ::std::
    _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
    ::~_Hashtable(&flags.higher._M_h);
  }
  else {
    __k = &(pSVar5->super_IVariant).self;
    if ((pSVar5->array).super_VectorView<unsigned_int>.buffer_size == 0) {
      flags.lower = CONCAT44(flags.lower._4_4_,(var->super_IVariant).self.id);
      pmVar7 = ::std::__detail::
               _Map_base<unsigned_int,_std::pair<const_unsigned_int,_bool>,_std::allocator<std::pair<const_unsigned_int,_bool>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
               ::operator[]((_Map_base<unsigned_int,_std::pair<const_unsigned_int,_bool>,_std::allocator<std::pair<const_unsigned_int,_bool>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                             *)&(this->super_CompilerGLSL).flattened_structs,(key_type *)&flags);
      *pmVar7 = false;
      (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[6])(&flags,this,(ulong)__k->id,0);
      pmVar8 = ::std::__detail::
               _Map_base<spirv_cross::TypedID<(spirv_cross::Types)0>,_std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>,_std::allocator<std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>_>,_std::__detail::_Select1st,_std::equal_to<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::hash<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
               ::operator[]((_Map_base<spirv_cross::TypedID<(spirv_cross::Types)0>,_std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>,_std::allocator<std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>_>,_std::__detail::_Select1st,_std::equal_to<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::hash<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                             *)&(this->super_CompilerGLSL).super_Compiler.ir.meta,__k);
      local_f0 = &(var->super_IVariant).self;
      if ((((pmVar8->decoration).alias._M_string_length == 0) ||
          (iVar9 = ::std::
                   _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                   ::find(&(this->super_CompilerGLSL).resource_names._M_h,(key_type *)&flags),
          iVar9.
          super__Node_iterator_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
          ._M_cur != (__node_type *)0x0)) ||
         (iVar9 = ::std::
                  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                  ::find(&(this->super_CompilerGLSL).block_names._M_h,(key_type *)&flags),
         iVar9.
         super__Node_iterator_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
         ._M_cur != (__node_type *)0x0)) {
        (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[4])
                  (&__node_gen,this,(ulong)local_f0->id);
        ::std::__cxx11::string::_M_assign((string *)&flags);
        if (__node_gen._M_h != local_100) {
          operator_delete(__node_gen._M_h);
        }
      }
      variables_primary = &(this->super_CompilerGLSL).block_names;
      CompilerGLSL::add_variable
                (&this->super_CompilerGLSL,variables_primary,
                 &(this->super_CompilerGLSL).resource_names,(string *)&flags);
      if (flags.higher._M_h._M_buckets == (__buckets_ptr)0x0) {
        pSVar5 = Variant::get<spirv_cross::SPIRType>
                           ((this->super_CompilerGLSL).super_Compiler.ir.ids.
                            super_VectorView<spirv_cross::Variant>.ptr +
                            *(uint *)&(var->super_IVariant).field_0xc);
        join<char_const(&)[2],spirv_cross::TypedID<(spirv_cross::Types)0>&,char_const(&)[2],spirv_cross::TypedID<(spirv_cross::Types)0>const&>
                  ((string *)&__node_gen,(spirv_cross *)0x2e7de5,
                   (char (*) [2])&(pSVar5->super_IVariant).self,
                   (TypedID<(spirv_cross::Types)0> *)0x2e7de5,(char (*) [2])local_f0,in_R9);
        ::std::__cxx11::string::operator=((string *)&flags,(string *)&__node_gen);
        pSVar5 = local_e8;
        if (__node_gen._M_h != local_100) {
          operator_delete(__node_gen._M_h);
          pSVar5 = local_e8;
        }
      }
      _failed_index_1 = (char *)((ulong)uStack_9c << 0x20);
      ts_2 = (string *)0x0;
      bVar4 = CompilerGLSL::buffer_is_packing_standard
                        (&this->super_CompilerGLSL,pSVar5,BufferPackingHLSLCbufferPackOffset,
                         &failed_index_1,0,0xffffffff);
      if (!bVar4) {
        prVar12 = (runtime_error *)__cxa_allocate_exception(0x10);
        CompilerGLSL::to_member_name_abi_cxx11_
                  (&member_name,&this->super_CompilerGLSL,pSVar5,failed_index_1);
        join<char_const(&)[12],spirv_cross::TypedID<(spirv_cross::Types)0>const&,char_const(&)[9],std::__cxx11::string&,char_const(&)[17],unsigned_int&,char_const(&)[9],std::__cxx11::string,char_const(&)[69]>
                  ((string *)&__node_gen,(spirv_cross *)0x2e7845,(char (*) [12])local_f0,
                   (TypedID<(spirv_cross::Types)0> *)" (name: ",(char (*) [9])&flags,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   "), member index ",(char (*) [17])&failed_index_1,(uint *)" (name: ",
                   (char (*) [9])&member_name,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   ") cannot be expressed with either HLSL packing layout or packoffset.",
                   in_stack_fffffffffffffee8);
        ::std::runtime_error::runtime_error(prVar12,(string *)&__node_gen);
        *(undefined ***)prVar12 = &PTR__runtime_error_0035b0b8;
        __cxa_throw(prVar12,&CompilerError::typeinfo,::std::runtime_error::~runtime_error);
      }
      Compiler::set_extended_decoration
                ((Compiler *)this,__k->id,SPIRVCrossDecorationExplicitOffset,0);
      __node_gen._M_h = (__hashtable_alloc *)variables_primary;
      ::std::
      _Hashtable<std::__cxx11::string,std::__cxx11::string,std::allocator<std::__cxx11::string>,std::__detail::_Identity,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
      ::
      _M_insert<std::__cxx11::string_const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<std::__cxx11::string,true>>>>
                ((_Hashtable<std::__cxx11::string,std::__cxx11::string,std::allocator<std::__cxx11::string>,std::__detail::_Identity,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
                  *)variables_primary,&flags);
      __node_gen._M_h._0_4_ = local_f0->id;
      pmVar10 = ::std::__detail::
                _Map_base<unsigned_int,_std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                ::operator[]((_Map_base<unsigned_int,_std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                              *)&(this->super_CompilerGLSL).super_Compiler.declared_block_names,
                             (key_type *)&__node_gen);
      ::std::__cxx11::string::_M_assign((string *)pmVar10);
      ::std::
      _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
      ::clear(&(pSVar5->member_name_cache)._M_h);
      CompilerGLSL::preserve_alias_on_reset(&this->super_CompilerGLSL,local_f0->id);
      CompilerGLSL::add_resource_name(&this->super_CompilerGLSL,local_f0->id);
      to_resource_binding_abi_cxx11_((string *)&__node_gen,this,var);
      CompilerGLSL::statement<char_const(&)[9],std::__cxx11::string&,std::__cxx11::string>
                (&this->super_CompilerGLSL,(char (*) [9])"cbuffer ",
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&flags,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&__node_gen);
      if (__node_gen._M_h != local_100) {
        operator_delete(__node_gen._M_h);
      }
      CompilerGLSL::begin_scope(&this->super_CompilerGLSL);
      sVar2 = (pSVar5->member_types).super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>.
              buffer_size;
      if (sVar2 != 0) {
        local_38 = (pSVar5->member_types).
                   super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>.ptr;
        lVar15 = sVar2 << 2;
        uVar14 = 0;
        do {
          index = (uint32_t)uVar14;
          CompilerGLSL::add_member_name(&this->super_CompilerGLSL,pSVar5,index);
          psVar11 = Compiler::get_member_name_abi_cxx11_((Compiler *)this,(TypeID)__k->id,index);
          __node_gen._M_h = local_100;
          pcVar3 = (psVar11->_M_dataplus)._M_p;
          ::std::__cxx11::string::_M_construct<char*>
                    ((string *)&__node_gen,pcVar3,pcVar3 + psVar11->_M_string_length);
          CompilerGLSL::to_member_name_abi_cxx11_
                    (&member_name,&this->super_CompilerGLSL,pSVar5,index);
          (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[6])
                    ((spirv_cross *)&failed_index,this,(ulong)local_f0->id,1);
          join<std::__cxx11::string,char_const(&)[2],std::__cxx11::string&>
                    (&local_c0,(spirv_cross *)&failed_index,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x2e7de5,
                     (char (*) [2])&member_name,ts_2);
          ::std::__cxx11::string::operator=((string *)&member_name,(string *)&local_c0);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_c0._M_dataplus._M_p != &local_c0.field_2) {
            operator_delete(local_c0._M_dataplus._M_p);
          }
          if (_failed_index != local_48) {
            operator_delete(_failed_index);
          }
          ParsedIR::sanitize_underscores(&member_name);
          Compiler::set_member_name((Compiler *)this,(TypeID)__k->id,index,&member_name);
          uVar1 = local_38[uVar14].id;
          local_c0._M_dataplus._M_p = (pointer)&local_c0.field_2;
          ts_2 = &local_c0;
          ::std::__cxx11::string::_M_construct<char_const*>((string *)ts_2,"");
          (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[0x15])
                    (this,local_e8,(ulong)uVar1,uVar14 & 0xffffffff,ts_2,0);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_c0._M_dataplus._M_p != &local_c0.field_2) {
            operator_delete(local_c0._M_dataplus._M_p);
          }
          Compiler::set_member_name((Compiler *)this,(TypeID)__k->id,index,(string *)&__node_gen);
          pSVar5 = local_e8;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)member_name._M_dataplus._M_p != &member_name.field_2) {
            operator_delete(member_name._M_dataplus._M_p);
          }
          if (__node_gen._M_h != local_100) {
            operator_delete(__node_gen._M_h);
          }
          uVar14 = uVar14 + 1;
          lVar15 = lVar15 + -4;
        } while (lVar15 != 0);
      }
      CompilerGLSL::end_scope_decl(&this->super_CompilerGLSL);
      CompilerGLSL::statement<char_const(&)[1]>(&this->super_CompilerGLSL,(char (*) [1])0x2dc0a8);
      if ((size_type *)flags.lower == &flags.higher._M_h._M_bucket_count) {
        return;
      }
    }
    else {
      if (*(uint *)&(this->super_CompilerGLSL).field_0x241c < 0x33) {
        prVar12 = (runtime_error *)__cxa_allocate_exception(0x10);
        flags.lower = (uint64_t)&flags.higher._M_h._M_bucket_count;
        ::std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&flags,
                   "Need ConstantBuffer<T> to use arrays of UBOs, but this is only supported in SM 5.1."
                   ,"");
        ::std::runtime_error::runtime_error(prVar12,(string *)&flags);
        *(undefined ***)prVar12 = &PTR__runtime_error_0035b0b8;
        __cxa_throw(prVar12,&CompilerError::typeinfo,::std::runtime_error::~runtime_error);
      }
      CompilerGLSL::add_resource_name(&this->super_CompilerGLSL,(pSVar5->super_IVariant).self.id);
      ts = &(var->super_IVariant).self;
      CompilerGLSL::add_resource_name(&this->super_CompilerGLSL,(var->super_IVariant).self.id);
      _failed_index = (char *)((ulong)uStack_54 << 0x20);
      bVar4 = CompilerGLSL::buffer_is_packing_standard
                        (&this->super_CompilerGLSL,pSVar5,BufferPackingHLSLCbuffer,&failed_index,0,
                         0xffffffff);
      if (!bVar4) {
        prVar12 = (runtime_error *)__cxa_allocate_exception(0x10);
        (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[6])
                  (&__node_gen,this,(ulong)__k->id,1);
        CompilerGLSL::to_member_name_abi_cxx11_
                  (&member_name,&this->super_CompilerGLSL,local_e8,failed_index);
        join<char_const(&)[27],spirv_cross::TypedID<(spirv_cross::Types)0>const&,char_const(&)[9],std::__cxx11::string,char_const(&)[17],unsigned_int&,char_const(&)[9],std::__cxx11::string,char_const(&)[54]>
                  ((string *)&flags,(spirv_cross *)"HLSL ConstantBuffer<T> ID ",(char (*) [27])ts,
                   (TypedID<(spirv_cross::Types)0> *)" (name: ",(char (*) [9])&__node_gen,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   "), member index ",(char (*) [17])&failed_index,(uint *)" (name: ",
                   (char (*) [9])&member_name,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   ") cannot be expressed with normal HLSL packing rules.",
                   (char (*) [54])in_stack_fffffffffffffee8);
        ::std::runtime_error::runtime_error(prVar12,(string *)&flags);
        *(undefined ***)prVar12 = &PTR__runtime_error_0035b0b8;
        __cxa_throw(prVar12,&CompilerError::typeinfo,::std::runtime_error::~runtime_error);
      }
      type = Variant::get<spirv_cross::SPIRType>
                       ((this->super_CompilerGLSL).super_Compiler.ir.ids.
                        super_VectorView<spirv_cross::Variant>.ptr + __k->id);
      CompilerGLSL::emit_struct(&this->super_CompilerGLSL,type);
      (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[6])(&flags,this,(ulong)__k->id,1);
      (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[6])
                (&__node_gen,this,(ulong)ts->id,1);
      (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[0x23])(&member_name,this,pSVar5);
      to_resource_binding_abi_cxx11_(&local_c0,this,var);
      CompilerGLSL::
      statement<char_const(&)[16],std::__cxx11::string,char_const(&)[3],std::__cxx11::string,std::__cxx11::string,std::__cxx11::string,char_const(&)[2]>
                (&this->super_CompilerGLSL,(char (*) [16])"ConstantBuffer<",
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&flags,
                 (char (*) [3])0x2e35e8,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&__node_gen,
                 &member_name,&local_c0,(char (*) [2])0x2ddbde);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_c0._M_dataplus._M_p != &local_c0.field_2) {
        operator_delete(local_c0._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)member_name._M_dataplus._M_p != &member_name.field_2) {
        operator_delete(member_name._M_dataplus._M_p);
      }
      if (__node_gen._M_h != local_100) {
        operator_delete(__node_gen._M_h);
      }
      if ((size_type *)flags.lower == &flags.higher._M_h._M_bucket_count) {
        return;
      }
    }
    operator_delete((void *)flags.lower);
  }
  return;
}

Assistant:

void CompilerHLSL::emit_buffer_block(const SPIRVariable &var)
{
	auto &type = get<SPIRType>(var.basetype);

	bool is_uav = var.storage == StorageClassStorageBuffer || has_decoration(type.self, DecorationBufferBlock);

	if (is_uav)
	{
		Bitset flags = ir.get_buffer_block_flags(var);
		bool is_readonly = flags.get(DecorationNonWritable) && !is_hlsl_force_storage_buffer_as_uav(var.self);
		bool is_coherent = flags.get(DecorationCoherent) && !is_readonly;
		bool is_interlocked = interlocked_resources.count(var.self) > 0;
		const char *type_name = "ByteAddressBuffer ";
		if (!is_readonly)
			type_name = is_interlocked ? "RasterizerOrderedByteAddressBuffer " : "RWByteAddressBuffer ";
		add_resource_name(var.self);
		statement(is_coherent ? "globallycoherent " : "", type_name, to_name(var.self), type_to_array_glsl(type),
		          to_resource_binding(var), ";");
	}
	else
	{
		if (type.array.empty())
		{
			// Flatten the top-level struct so we can use packoffset,
			// this restriction is similar to GLSL where layout(offset) is not possible on sub-structs.
			flattened_structs[var.self] = false;

			// Prefer the block name if possible.
			auto buffer_name = to_name(type.self, false);
			if (ir.meta[type.self].decoration.alias.empty() ||
			    resource_names.find(buffer_name) != end(resource_names) ||
			    block_names.find(buffer_name) != end(block_names))
			{
				buffer_name = get_block_fallback_name(var.self);
			}

			add_variable(block_names, resource_names, buffer_name);

			// If for some reason buffer_name is an illegal name, make a final fallback to a workaround name.
			// This cannot conflict with anything else, so we're safe now.
			if (buffer_name.empty())
				buffer_name = join("_", get<SPIRType>(var.basetype).self, "_", var.self);

			uint32_t failed_index = 0;
			if (buffer_is_packing_standard(type, BufferPackingHLSLCbufferPackOffset, &failed_index))
				set_extended_decoration(type.self, SPIRVCrossDecorationExplicitOffset);
			else
			{
				SPIRV_CROSS_THROW(join("cbuffer ID ", var.self, " (name: ", buffer_name, "), member index ",
				                       failed_index, " (name: ", to_member_name(type, failed_index),
				                       ") cannot be expressed with either HLSL packing layout or packoffset."));
			}

			block_names.insert(buffer_name);

			// Save for post-reflection later.
			declared_block_names[var.self] = buffer_name;

			type.member_name_cache.clear();
			// var.self can be used as a backup name for the block name,
			// so we need to make sure we don't disturb the name here on a recompile.
			// It will need to be reset if we have to recompile.
			preserve_alias_on_reset(var.self);
			add_resource_name(var.self);
			statement("cbuffer ", buffer_name, to_resource_binding(var));
			begin_scope();

			uint32_t i = 0;
			for (auto &member : type.member_types)
			{
				add_member_name(type, i);
				auto backup_name = get_member_name(type.self, i);
				auto member_name = to_member_name(type, i);
				member_name = join(to_name(var.self), "_", member_name);
				ParsedIR::sanitize_underscores(member_name);
				set_member_name(type.self, i, member_name);
				emit_struct_member(type, member, i, "");
				set_member_name(type.self, i, backup_name);
				i++;
			}

			end_scope_decl();
			statement("");
		}
		else
		{
			if (hlsl_options.shader_model < 51)
				SPIRV_CROSS_THROW(
				    "Need ConstantBuffer<T> to use arrays of UBOs, but this is only supported in SM 5.1.");

			add_resource_name(type.self);
			add_resource_name(var.self);

			// ConstantBuffer<T> does not support packoffset, so it is unuseable unless everything aligns as we expect.
			uint32_t failed_index = 0;
			if (!buffer_is_packing_standard(type, BufferPackingHLSLCbuffer, &failed_index))
			{
				SPIRV_CROSS_THROW(join("HLSL ConstantBuffer<T> ID ", var.self, " (name: ", to_name(type.self),
				                       "), member index ", failed_index, " (name: ", to_member_name(type, failed_index),
				                       ") cannot be expressed with normal HLSL packing rules."));
			}

			emit_struct(get<SPIRType>(type.self));
			statement("ConstantBuffer<", to_name(type.self), "> ", to_name(var.self), type_to_array_glsl(type),
			          to_resource_binding(var), ";");
		}
	}
}